

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O3

DAngle __thiscall DBot::FireRox(DBot *this,AActor *enemy,ticcmd_t *cmd)

{
  uint uVar1;
  _func_int **pp_Var2;
  AActor *thing;
  bool bVar3;
  int iVar4;
  PClass *pPVar5;
  ticcmd_t *in_RCX;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 this_00;
  double dVar7;
  double extraout_XMM0_Qa;
  DAngle DVar8;
  double extraout_XMM0_Qa_00;
  DVector2 local_d8;
  FCheckPosition local_c8;
  
  pp_Var2 = (enemy->snext->super_DThinker).super_DObject._vptr_DObject;
  local_c8.pos.Y = (double)pp_Var2[0x30] * 0.5 + (double)pp_Var2[0xb];
  local_c8.thing = (AActor *)((double)pp_Var2[0x19] * 5.0 + (double)pp_Var2[9]);
  local_c8.pos.X = (double)pp_Var2[0x1a] * 5.0 + (double)pp_Var2[10];
  FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&local_c8,2);
  if (bglobal.body2.field_0 == (AActor *)0x0) {
LAB_0034c384:
    this_00.p = (AActor *)0x0;
  }
  else {
    this_00 = bglobal.body2.field_0;
    if ((*(byte *)((long)bglobal.body2.field_0 + 0x20) & 0x20) != 0) {
      bglobal.body2.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
      goto LAB_0034c384;
    }
  }
  dVar7 = AActor::Distance2D(this_00.p,(AActor *)cmd,false);
  if (dVar7 < 140.0) goto LAB_0034c560;
  iVar4 = FName::NameManager::FindName(&FName::NameData,"Rocket",true);
  local_c8.thing = (AActor *)CONCAT44(local_c8.thing._4_4_,iVar4);
  pPVar5 = PClass::FindClass((FName *)&local_c8);
  dVar7 = (dVar7 + 1.0) / *(double *)(pPVar5->Defaults + 0xe0) + 2.0;
  local_c8.thing = (AActor *)(dVar7 * *(double *)&cmd[10].ucmd + *(double *)&cmd[3].ucmd.sidemove);
  local_c8.pos.X = dVar7 * *(double *)&cmd[10].ucmd.roll + *(double *)&cmd[4].ucmd;
  local_c8.pos.Y = -2147483648.0;
  FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&local_c8,1);
  if (bglobal.body1.field_0 == (AActor *)0x0) {
LAB_0034c451:
    aVar6.p = (AActor *)0x0;
  }
  else {
    aVar6 = bglobal.body1.field_0;
    if ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0) {
      bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
      goto LAB_0034c451;
    }
  }
  bVar3 = P_CheckSight(this_00.p,aVar6.p,1);
  if (bVar3) {
    local_c8.LastRipped.NumUsed = 0;
    TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
              (&local_c8.LastRipped,1);
    local_c8.DoRipping = false;
    local_c8.PushTime = 0;
    local_c8.FromPMove = false;
    thing = (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject;
    uVar1 = (thing->flags).Value;
    (thing->flags).Value = uVar1 & 0xfffff7ff;
    local_d8.X = ((this_00.p)->__Pos).X;
    local_d8.Y = ((this_00.p)->__Pos).Y;
    bVar3 = P_CheckPosition(thing,&local_d8,&local_c8,false);
    (thing->flags).Value = uVar1;
    if (bVar3) {
      if (bglobal.body1.field_0 == (AActor *)0x0) {
LAB_0034c4f6:
        aVar6.p = (AActor *)0x0;
      }
      else {
        aVar6 = bglobal.body1.field_0;
        if ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0) {
          bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
          goto LAB_0034c4f6;
        }
      }
      dVar7 = FCajunMaster::FakeFire(&bglobal,this_00.p,aVar6.p,in_RCX);
      if (140.0 <= dVar7) {
        if (bglobal.body1.field_0 == (AActor *)0x0) {
          aVar6.p = (AActor *)0x0;
        }
        else {
          aVar6 = bglobal.body1.field_0;
          if ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0) {
            bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
            aVar6.p = (AActor *)0x0;
          }
        }
        AActor::AngleTo((AActor *)this,this_00.p,aVar6._0_1_);
        M_Free(local_c8.LastRipped.Nodes);
        return (DAngle)extraout_XMM0_Qa_00;
      }
    }
    M_Free(local_c8.LastRipped.Nodes);
  }
  bVar3 = P_CheckSight(this_00.p,(AActor *)cmd,0);
  dVar7 = extraout_XMM0_Qa;
  if ((bVar3) &&
     (dVar7 = FCajunMaster::FakeFire
                        (&bglobal,(AActor *)
                                  (enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                         (AActor *)cmd,in_RCX), 140.0 <= dVar7)) {
    DVar8 = AActor::AngleTo((AActor *)this,
                            (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                            SUB81(cmd,0));
    return (DAngle)DVar8.Degrees;
  }
LAB_0034c560:
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)0x0;
  return (DAngle)dVar7;
}

Assistant:

DAngle DBot::FireRox (AActor *enemy, ticcmd_t *cmd)
{
	double dist;
	AActor *actor;
	double m;

	bglobal.SetBodyAt(player->mo->PosPlusZ(player->mo->Height / 2) + player->mo->Vel.XY() * 5, 2);

	actor = bglobal.body2;

	dist = actor->Distance2D (enemy);
	if (dist < SAFE_SELF_MISDIST)
		return 0.;
	//Predict.
	m = ((dist+1) / GetDefaultByName("Rocket")->Speed);

	bglobal.SetBodyAt(DVector3((enemy->Pos() + enemy->Vel * (m + 2)), ONFLOORZ), 1);
	
	//try the predicted location
	if (P_CheckSight (actor, bglobal.body1, SF_IGNOREVISIBILITY)) //See the predicted location, so give a test missile
	{
		FCheckPosition tm;
		if (bglobal.SafeCheckPosition (player->mo, actor->X(), actor->Y(), tm))
		{
			if (bglobal.FakeFire (actor, bglobal.body1, cmd) >= SAFE_SELF_MISDIST)
			{
				return actor->AngleTo(bglobal.body1);
			}
		}
	}
	//Try fire straight.
	if (P_CheckSight (actor, enemy, 0))
	{
		if (bglobal.FakeFire (player->mo, enemy, cmd) >= SAFE_SELF_MISDIST)
		{
			return player->mo->AngleTo(enemy);
		}
	}
	return 0.;
}